

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O2

double __thiscall mjs::anon_unknown_37::date_helper::parse(date_helper *this,wstring_view s)

{
  bool bVar1;
  int iVar2;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  long *plVar4;
  long lVar5;
  _Get_time<wchar_t> __f;
  _Get_time<wchar_t> __f_00;
  double local_1e8;
  wchar_t digits [3];
  tm tm;
  wstring_view s_local;
  wistringstream wiss;
  byte abStack_168 [352];
  
  s_local._M_str = (wchar_t *)s._M_len;
  s_local._M_len = (size_t)this;
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&tm,&s_local,(allocator<wchar_t> *)digits);
  std::__cxx11::wistringstream::basic_istringstream((wstring *)&wiss,(_Ios_Openmode)&tm);
  std::__cxx11::wstring::~wstring((wstring *)&tm);
  __f._M_fmt = L"%Y-%m-%dT%H:%M:%S";
  __f._M_tmb = &tm;
  pbVar3 = std::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)&wiss,__f);
  if (((byte)pbVar3[*(long *)(*(long *)pbVar3 + -0x18) + 0x20] & 5) == 0) {
    local_1e8 = time_from_tm(&tm);
    iVar2 = std::wistream::peek();
    if (iVar2 == 0x2e) {
      std::wistream::get();
      plVar4 = (long *)std::wistream::read((wchar_t *)&wiss,(long)digits);
      if (((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) ||
         (bVar1 = std::all_of<wchar_t*,int(*)(int)noexcept>(digits,&tm.tm_sec,isdigit), !bVar1))
      goto LAB_0015b09f;
      local_1e8 = local_1e8 + (double)(digits[2] + digits[1] * 10 + digits[0] * 100 + -0x14d0);
    }
    iVar2 = std::wistream::peek();
    if (iVar2 == 0x5a) {
      std::wistream::get();
    }
    lVar5 = std::wstreambuf::in_avail();
    if (lVar5 == 0) goto LAB_0015b0ac;
  }
  else {
    std::wistream::seekg(&wiss,0,0);
    std::wios::clear((int)&wiss + (int)*(undefined8 *)(_wiss + -0x18));
    if ((abStack_168[*(long *)(_wiss + -0x18)] & 5) != 0) {
      __assert_fail("wiss",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp"
                    ,0xb9,
                    "static double mjs::(anonymous namespace)::date_helper::parse(const std::wstring_view)"
                   );
    }
    __f_00._M_fmt = L"%a %b %d %Y %H:%M:%S";
    __f_00._M_tmb = &tm;
    pbVar3 = std::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)&wiss,__f_00);
    if (((byte)pbVar3[*(long *)(*(long *)pbVar3 + -0x18) + 0x20] & 5) == 0) {
      local_1e8 = time_from_tm(&tm);
      goto LAB_0015b0ac;
    }
  }
LAB_0015b09f:
  local_1e8 = NAN;
LAB_0015b0ac:
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)&wiss);
  return local_1e8;
}

Assistant:

static double parse(const std::wstring_view s) {
        std::wistringstream wiss{std::wstring{s}};
        std::tm tm;
        if (wiss >> std::get_time(&tm, iso_format)) {
            auto t = time_from_tm(tm);
            if (wiss.peek() == '.') {
                wiss.get();
                const int num_digits = 3;
                wchar_t digits[num_digits];
                if (!wiss.read(digits, num_digits) || !std::all_of(digits, digits+num_digits, isdigit)) {
                    return NAN;
                }
                t += (digits[0]-'0')*100 + (digits[1]-'0')*10 + (digits[2]-'0');
            }
            if (wiss.peek() == 'Z') {
                wiss.get();
            }
            return !wiss.rdbuf()->in_avail() ? t : NAN;
        } 
        wiss.seekg(0);
        wiss.clear();
        assert(wiss);
        if (wiss >> std::get_time(&tm, time_format)) {
            return time_from_tm(tm);
        }
        return NAN;
    }